

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::CreateImageFromTexture::CreateImageFromTexture
          (CreateImageFromTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,
          SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,bool serverSync)

{
  EGLImage *this_00;
  Texture *pTVar1;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_48 [2];
  undefined1 local_22;
  undefined1 local_21;
  bool serverSync_local;
  FenceSync *pFStack_20;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image_local;
  CreateImageFromTexture *this_local;
  
  local_22 = serverSync;
  local_21 = useSync;
  pFStack_20 = (FenceSync *)texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)image;
  image_local = (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)this;
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateImageFromTexture_03277a28;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&this->m_image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (local_48,texture);
  Operation::modifyGLObject(&this->super_Operation,local_48);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_48);
  this_00 = (EGLImage *)operator_new(0x68);
  tcu::ThreadUtil::Operation::getEvent((Operation *)local_68);
  Operation::getSync((Operation *)local_78);
  EGLImage::EGLImage(this_00,(SharedPtr<tcu::ThreadUtil::Event> *)local_68,
                     (SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_78);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)(local_68 + 0x10),this_00);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)texture_local,
             (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)(local_68 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)(local_68 + 0x10));
  de::SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *)local_78);
  de::SharedPtr<tcu::ThreadUtil::Event>::~SharedPtr((SharedPtr<tcu::ThreadUtil::Event> *)local_68);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=
            (&this->m_image,(SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)texture_local);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator=(&this->m_texture,texture);
  pTVar1 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::operator->(&this->m_texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::operator=
            (&pTVar1->sourceImage,&this->m_image);
  return;
}

Assistant:

CreateImageFromTexture::CreateImageFromTexture (SharedPtr<EGLImage>& image, SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
{
	modifyGLObject(SharedPtr<Object>(texture));
	image = SharedPtr<EGLImage>(new EGLImage(getEvent(), getSync()));

	m_image					= image;
	m_texture				= texture;
	m_texture->sourceImage	= m_image;
}